

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

DescriptorPool * google::protobuf::anon_unknown_1::NewGeneratedPool(void)

{
  DescriptorPool *this;
  EncodedDescriptorDatabase *fallback_database;
  
  this = (DescriptorPool *)operator_new(0x60);
  fallback_database = GeneratedDatabase();
  DescriptorPool::DescriptorPool
            (this,&fallback_database->super_DescriptorDatabase,(ErrorCollector *)0x0);
  this->enforce_dependencies_ = false;
  this->lazily_build_dependencies_ = true;
  return this;
}

Assistant:

DescriptorPool* NewGeneratedPool() {
  auto generated_pool = new DescriptorPool(GeneratedDatabase());
  generated_pool->InternalSetLazilyBuildDependencies();
  return generated_pool;
}